

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  uint uVar1;
  pointer pPVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  float fVar6;
  Random rnd;
  allocator_type local_85;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  deRandom local_70;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_60;
  value_type local_48;
  
  deRandom_init(&local_70,
                *(uint *)&(this->m_data).field_0x24 ^
                *(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c ^ 0xc2a39f);
  uVar4 = *(int *)&(this->m_data).super_DrawParamsBase.field_0x1c +
          *(int *)&(this->m_data).field_0x24;
  local_48.position.m_data[0] = 0.0;
  local_48.position.m_data[1] = 0.0;
  local_48.position.m_data[2] = 0.0;
  local_48.position.m_data[3] = 0.0;
  local_48.color.m_data[0] = 0.0;
  local_48.color.m_data[1] = 0.0;
  local_48.color.m_data[2] = 0.0;
  local_48.color.m_data[3] = 0.0;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector(&local_60,(ulong)uVar4,&local_48,&local_85);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&this->m_data,&local_60);
  if (local_60.
      super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = *(uint *)&(this->m_data).field_0x24;
  if (uVar1 < uVar4) {
    lVar5 = (ulong)uVar4 - (ulong)uVar1;
    uVar3 = (ulong)uVar1 << 5 | 0x1c;
    do {
      fVar6 = deRandom_getFloat(&local_70);
      local_74 = fVar6 + fVar6 + -1.0;
      fVar6 = deRandom_getFloat(&local_70);
      local_78 = fVar6 + fVar6 + -1.0;
      local_7c = deRandom_getFloat(&local_70);
      local_7c = local_7c + 0.0;
      local_80 = deRandom_getFloat(&local_70);
      local_80 = local_80 + 0.0;
      local_84 = deRandom_getFloat(&local_70);
      local_84 = local_84 + 0.0;
      fVar6 = deRandom_getFloat(&local_70);
      pPVar2 = (this->m_data).super_DrawParamsBase.vertices.
               super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(float *)((long)&pPVar2->position + uVar3 + -0x1c) = local_74;
      *(float *)((long)&pPVar2->position + uVar3 + -0x18) = local_78;
      *(undefined8 *)((long)&pPVar2->position + uVar3 + -0x14) = 0x3f8000003f800000;
      *(float *)((long)&pPVar2->position + uVar3 + -0xc) = local_7c;
      *(float *)((long)&pPVar2->position + uVar3 + -8) = local_80;
      *(float *)((long)&pPVar2->position + uVar3 + -4) = local_84;
      *(float *)((long)&pPVar2->position + uVar3) = fVar6 + 0.0;
      uVar3 = uVar3 + 0x20;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.params.firstVertex ^ m_data.params.vertexCount);

	const deUint32	vectorSize	= m_data.params.firstVertex + m_data.params.vertexCount;

	// Initialize the vector
	m_data.vertices = std::vector<PositionColorVertex>(vectorSize, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Fill only the used indexes
	for (deUint32 vertexIdx = m_data.params.firstVertex; vertexIdx < vectorSize; ++vertexIdx)
	{
		m_data.vertices[vertexIdx] = PositionColorVertex(
			tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0),										// Coord
			tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0)));	// Color
	}
}